

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O0

void makeInput(int id,string *str)

{
  Value *this;
  Value *other;
  size_t in_RCX;
  undefined8 in_RSI;
  int i_1;
  int i;
  Value *res;
  Value *req;
  Value input;
  FastWriter writer;
  ofstream fin;
  Value *in_stack_fffffffffffffcb8;
  FastWriter *in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcc8;
  ValueType type;
  Value *in_stack_fffffffffffffcd0;
  Value *in_stack_fffffffffffffcd8;
  int index;
  Value *in_stack_fffffffffffffce0;
  string local_308 [32];
  undefined8 in_stack_fffffffffffffd18;
  Value *in_stack_fffffffffffffd20;
  int local_2bc;
  int local_28c;
  undefined1 local_278 [56];
  undefined1 local_240 [48];
  ostream local_210 [528];
  
  type = (ValueType)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  std::ofstream::ofstream(local_210,in_RSI,0x10);
  Json::FastWriter::FastWriter(in_stack_fffffffffffffcc0);
  Json::Value::Value(in_stack_fffffffffffffcd0,type);
  this = Json::Value::operator[]
                   ((Value *)in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8);
  Json::Value::operator[]((Value *)in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8);
  for (local_28c = 1; index = (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20), local_28c <= turnID;
      local_28c = local_28c + 1) {
    in_stack_fffffffffffffce0 = Json::Value::operator[](in_stack_fffffffffffffce0,index);
    in_stack_fffffffffffffcd8 = Json::Value::operator[](in_stack_fffffffffffffce0,index);
    Json::Value::Value(in_stack_fffffffffffffd20,(Value *)in_stack_fffffffffffffd18);
    Json::Value::operator[]
              (in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
    Json::Value::operator=((Value *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    Json::Value::~Value(this);
  }
  for (local_2bc = 1; local_2bc < turnID; local_2bc = local_2bc + 1) {
    Json::Value::operator[]
              (in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
    in_stack_fffffffffffffcc0 =
         (FastWriter *)
         Json::Value::operator[]
                   (in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
    Json::Value::Value(in_stack_fffffffffffffd20,(Value *)in_stack_fffffffffffffd18);
    other = Json::Value::operator[]
                      (in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
    Json::Value::operator=((Value *)in_stack_fffffffffffffcc0,other);
    Json::Value::~Value(this);
  }
  Json::FastWriter::write_abi_cxx11_((FastWriter *)local_308,(int)local_240,local_278,in_RCX);
  std::operator<<(local_210,local_308);
  std::__cxx11::string::~string(local_308);
  std::ofstream::close();
  Json::Value::~Value(this);
  Json::FastWriter::~FastWriter(in_stack_fffffffffffffcc0);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void makeInput(int id, string str)
{
    ofstream fin(str);
    Json::FastWriter writer;
    Json::Value input;
    Json::Value &req = input["requests"];
    Json::Value &res = input["responses"];
    for (int i = 1; i <= turnID; ++i)
        req[i - 1] = logger[i - 1][id];
    for (int i = 1; i < turnID; ++i)
        res[i - 1] = logger[i][1 - id];
    fin << writer.write(input);
    fin.close();
}